

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.hpp
# Opt level: O2

bool helics::isIgnoreableCommand(ActionMessage *command)

{
  action_t aVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = isDisconnectCommand(command);
  bVar3 = true;
  if (!bVar2) {
    aVar1 = command->messageAction;
    if ((((0xf < (uint)(aVar1 + 0xffffd8fa)) || ((0xa401U >> (aVar1 + 0xffffd8fa & 0x1fU) & 1) == 0)
         ) && (aVar1 != cmd_request_current_time)) &&
       (((aVar1 != cmd_log && (aVar1 != cmd_time_request)) && (aVar1 != cmd_remote_log)))) {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

inline bool isIgnoreableCommand(const ActionMessage& command) noexcept
{
    if (isDisconnectCommand(command)) {
        return true;
    }
    if (isErrorCommand(command)) {
        return true;
    }
    switch (command.action()) {
        case CMD_LOG:
        case CMD_WARNING:
        case CMD_REMOTE_LOG:
        case CMD_TIME_REQUEST:
        case CMD_REQUEST_CURRENT_TIME:
            return true;
        default:
            return false;
    }
}